

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseTest.cpp
# Opt level: O0

void __thiscall BaseTest::solve<PrimMST<BinaryHeap,false>>(BaseTest *this,char *info)

{
  ostream *poVar1;
  ostream *__args;
  ostream *this_00;
  ostream *this_01;
  ostream *this_02;
  char *in_RSI;
  rep time;
  double ans;
  PrimMST<BinaryHeap,_false> solver;
  time_point beg;
  vector<Point2d,_std::allocator<Point2d>_> *in_stack_ffffffffffffff48;
  PrimMST<BinaryHeap,_false> *in_stack_ffffffffffffff50;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffff58;
  duration<long,_std::ratio<1L,_1000000000L>_> local_58;
  long local_50;
  double local_38;
  undefined8 local_18;
  
  poVar1 = std::operator<<((ostream *)&std::cout,in_RSI);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  local_18 = std::chrono::_V2::system_clock::now();
  PrimMST<BinaryHeap,_false>::PrimMST(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  local_38 = PrimMST<BinaryHeap,_false>::operator()((PrimMST<BinaryHeap,_false> *)this);
  std::chrono::_V2::system_clock::now();
  local_58.__r = (rep)std::chrono::operator-
                                (in_stack_ffffffffffffff58,
                                 (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                  *)in_stack_ffffffffffffff50);
  local_50 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&local_58);
  poVar1 = std::operator<<((ostream *)&std::cout,"use time : ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_50);
  __args = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  this_00 = std::operator<<(__args,"result : ");
  this_01 = (ostream *)std::ostream::operator<<(this_00,local_38);
  this_02 = (ostream *)std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(this_02,std::endl<char,std::char_traits<char>>);
  std::vector<BaseTest::Result,std::allocator<BaseTest::Result>>::
  emplace_back<char_const*&,double&,long&>
            ((vector<BaseTest::Result,_std::allocator<BaseTest::Result>_> *)poVar1,(char **)__args,
             (double *)this_00,(long *)this_01);
  PrimMST<BinaryHeap,_false>::~PrimMST((PrimMST<BinaryHeap,_false> *)0x107ab3);
  return;
}

Assistant:

void BaseTest::solve(const char *info)
{
	std::cout << info << std::endl;
	auto beg = now();
	MSTSolver solver(input);
	double ans = solver();
	auto time = (now() - beg).count();
	std::cout << "use time : " << time << std::endl
	          << "result : " << ans << std::endl
	          << std::endl;
	results.emplace_back(info, ans, time);
}